

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# webectl.cpp
# Opt level: O1

void send_to_pid(int pid,string *msg)

{
  long *plVar1;
  int __fd;
  long *plVar2;
  ssize_t sVar3;
  undefined8 extraout_RAX;
  uint uVar4;
  long *plVar5;
  ulong uVar6;
  uint __val;
  int iVar7;
  long *plVar8;
  string __str;
  sockaddr_un name;
  undefined1 *local_100 [2];
  undefined1 local_f0 [16];
  long *local_e0;
  long local_d8;
  long local_d0;
  long lStack_c8;
  long *local_c0;
  long local_b8;
  long local_b0;
  long lStack_a8;
  sockaddr local_9e [6];
  
  plVar8 = (long *)0x1;
  __fd = socket(1,2,0);
  if (__fd < 0) {
    send_to_pid();
  }
  else {
    local_9e[0].sa_family = 1;
    __val = -pid;
    if (0 < pid) {
      __val = pid;
    }
    if (9 < __val) {
      plVar8 = (long *)0x4;
      uVar6 = (ulong)__val;
      do {
        uVar4 = (uint)uVar6;
        iVar7 = (int)plVar8;
        if (uVar4 < 100) {
          plVar8 = (long *)(ulong)(iVar7 - 2);
          goto LAB_00102ade;
        }
        if (uVar4 < 1000) {
          plVar8 = (long *)(ulong)(iVar7 - 1);
          goto LAB_00102ade;
        }
        if (uVar4 < 10000) goto LAB_00102ade;
        uVar6 = uVar6 / 10000;
        plVar8 = (long *)(ulong)(iVar7 + 4);
      } while (99999 < uVar4);
      plVar8 = (long *)(ulong)(iVar7 + 1);
    }
LAB_00102ade:
    local_100[0] = local_f0;
    std::__cxx11::string::_M_construct((ulong)local_100,(char)plVar8 - (char)(pid >> 0x1f));
    std::__detail::__to_chars_10_impl<unsigned_int>
              (local_100[0] + ((uint)pid >> 0x1f),(uint)plVar8,__val);
    plVar2 = (long *)std::__cxx11::string::replace((ulong)local_100,0,(char *)0x0,0x10408e);
    plVar8 = &local_d0;
    plVar5 = plVar2 + 2;
    if ((long *)*plVar2 == plVar5) {
      local_d0 = *plVar5;
      lStack_c8 = plVar2[3];
      local_e0 = plVar8;
    }
    else {
      local_d0 = *plVar5;
      local_e0 = (long *)*plVar2;
    }
    local_d8 = plVar2[1];
    *plVar2 = (long)plVar5;
    plVar2[1] = 0;
    *(undefined1 *)(plVar2 + 2) = 0;
    plVar2 = (long *)std::__cxx11::string::append((char *)&local_e0);
    plVar5 = plVar2 + 2;
    if ((long *)*plVar2 == plVar5) {
      local_b0 = *plVar5;
      lStack_a8 = plVar2[3];
      local_c0 = &local_b0;
    }
    else {
      local_b0 = *plVar5;
      local_c0 = (long *)*plVar2;
    }
    plVar1 = local_c0;
    local_b8 = plVar2[1];
    *plVar2 = (long)plVar5;
    plVar2[1] = 0;
    *(undefined1 *)(plVar2 + 2) = 0;
    strcpy(local_9e[0].sa_data,(char *)local_c0);
    if (plVar1 != &local_b0) {
      operator_delete(plVar1);
    }
    if (local_e0 != plVar8) {
      operator_delete(local_e0);
    }
    if (local_100[0] != local_f0) {
      operator_delete(local_100[0]);
    }
    sVar3 = sendto(__fd,(msg->_M_dataplus)._M_p,msg->_M_string_length,0,local_9e,0x6e);
    if (-1 < sVar3) {
      close(__fd);
      return;
    }
  }
  send_to_pid();
  if (local_e0 != plVar8) {
    operator_delete(local_e0);
  }
  if (local_100[0] != local_f0) {
    operator_delete(local_100[0]);
  }
  _Unwind_Resume(extraout_RAX);
}

Assistant:

void send_to_pid(int pid, std::string msg) {
    int sock;
    struct sockaddr_un name;
    sock = socket(AF_UNIX, SOCK_DGRAM, 0);
    IF_NEGATIVE_EXIT(sock);
    name.sun_family = AF_UNIX;
    strcpy(name.sun_path, ("/tmp/webed_" + std::to_string(pid) + ".sock").c_str());
    IF_NEGATIVE_EXIT(sendto(sock, msg.c_str(), msg.size(), 0, (struct sockaddr *)&name, sizeof(struct sockaddr_un)))
    close(sock);
}